

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

void libtorrent::aux::parse_comma_separated_string
               (string *in,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  size_type sVar1;
  ulong uVar2;
  char *pcVar3;
  bool local_79;
  bool local_69;
  value_type local_50;
  ulong local_30;
  size_type soft_end;
  size_type end;
  size_type start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  string *in_local;
  
  start = (size_type)out;
  out_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  soft_end = 0;
  end = 0;
  while (sVar1 = end, uVar2 = ::std::__cxx11::string::size(), sVar1 < uVar2) {
    while( true ) {
      sVar1 = end;
      uVar2 = ::std::__cxx11::string::size();
      local_69 = false;
      if (sVar1 < uVar2) {
        pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)out_local);
        local_69 = is_space(*pcVar3);
      }
      if (local_69 == false) break;
      end = end + 1;
    }
    soft_end = ::std::__cxx11::string::find_first_of((char)out_local,0x2c);
    if (soft_end == 0xffffffffffffffff) {
      soft_end = ::std::__cxx11::string::size();
    }
    local_30 = soft_end;
    while( true ) {
      local_79 = false;
      if (end < local_30) {
        pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)out_local);
        local_79 = is_space(*pcVar3);
      }
      sVar1 = start;
      if (local_79 == false) break;
      local_30 = local_30 - 1;
    }
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)out_local);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)sVar1,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    end = soft_end + 1;
  }
  return;
}

Assistant:

void parse_comma_separated_string(std::string const& in, std::vector<std::string>& out)
	{
		out.clear();

		std::string::size_type start = 0;
		std::string::size_type end = 0;

		while (start < in.size())
		{
			// skip leading spaces
			while (start < in.size()
				&& is_space(in[start]))
				++start;

			end = in.find_first_of(',', start);
			if (end == std::string::npos) end = in.size();

			// skip trailing spaces
			std::string::size_type soft_end = end;
			while (soft_end > start
				&& is_space(in[soft_end - 1]))
				--soft_end;

			out.push_back(in.substr(start, soft_end - start));
			start = end + 1;
		}
	}